

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::Write(ON_LineCurve *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_LineCurve *this_local;
  
  local_19 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteLine(file,&this->m_line);
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteInterval(file,&this->m_t);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(file,this->m_dim);
    }
  }
  return local_19;
}

Assistant:

bool ON_LineCurve::Write(
       ON_BinaryArchive& file // open binary file
     ) const
{
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    rc = file.WriteLine( m_line );
    if (rc) rc = file.WriteInterval( m_t );
    if (rc) rc = file.WriteInt(m_dim);
  }
  return rc;
}